

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O2

String * axl::io::getTempDir(void)

{
  char *p;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  String tmpDir;
  
  p = getenv("TMPDIR");
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase(&tmpDir,p,0xffffffffffffffff);
  if (tmpDir.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length == 0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              (in_RDI,"/tmp",0xffffffffffffffff);
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase(in_RDI,&tmpDir);
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&tmpDir.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  return in_RDI;
}

Assistant:

sl::String
getTempDir() {
#if (_AXL_OS_WIN)
	return getTempDir_w();
#else
	sl::String tmpDir = ::getenv("TMPDIR");
	return !tmpDir.isEmpty() ? tmpDir : "/tmp";
#endif
}